

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O0

void __thiscall Assimp::FBXExporter::WriteHeaderExtension(FBXExporter *this)

{
  value_type vVar1;
  ulong uVar2;
  uint uVar3;
  ostream *poVar4;
  size_type __n;
  ulong uVar5;
  value_type *pvVar6;
  reference pvVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  allocator<char> local_611;
  string local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  allocator<char> local_5c9;
  string local_5c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_5a8;
  allocator<char> local_589;
  string local_588;
  ulong local_568;
  size_t i;
  undefined1 local_558 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> raw;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  allocator<char> local_511;
  string local_510;
  stringstream local_4f0 [8];
  stringstream creator;
  ostream local_4e0 [383];
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  tm *local_228;
  tm *now;
  time_t rawtime;
  string local_210;
  undefined1 local_1f0 [8];
  Node CreationTimeStamp;
  string local_178;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  int local_104;
  undefined1 local_100 [4];
  int indent;
  undefined1 local_f0 [8];
  StreamWriterLE outstream;
  allocator<char> local_a1;
  string local_a0;
  undefined1 local_80 [8];
  Node n;
  FBXExporter *this_local;
  
  n.property_start = (size_t)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"FBXHeaderExtension",&local_a1);
  FBX::Node::Node((Node *)local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::shared_ptr<Assimp::IOStream>::shared_ptr
            ((shared_ptr<Assimp::IOStream> *)local_100,&this->outfile);
  StreamWriter<false,_false>::StreamWriter
            ((StreamWriter<false,_false> *)local_f0,(shared_ptr<Assimp::IOStream> *)local_100,false)
  ;
  std::shared_ptr<Assimp::IOStream>::~shared_ptr((shared_ptr<Assimp::IOStream> *)local_100);
  local_104 = 0;
  FBX::Node::Begin((Node *)local_80,(StreamWriterLE *)local_f0,(bool)(this->binary & 1),0);
  FBX::Node::EndProperties
            ((Node *)local_80,(StreamWriterLE *)local_f0,(bool)(this->binary & 1),local_104,0);
  FBX::Node::BeginChildren
            ((Node *)local_80,(StreamWriterLE *)local_f0,(bool)(this->binary & 1),local_104);
  local_104 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"FBXHeaderVersion",&local_129);
  FBX::Node::WritePropertyNode<int>
            (&local_128,0x3eb,(StreamWriterLE *)local_f0,(bool)(this->binary & 1),local_104);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"FBXVersion",&local_151);
  FBX::Node::WritePropertyNode<int>
            (&local_150,0x1d4c,(StreamWriterLE *)local_f0,(bool)(this->binary & 1),local_104);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  if ((this->binary & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"EncryptionType",
               (allocator<char> *)((long)&CreationTimeStamp.property_start + 7));
    FBX::Node::WritePropertyNode<int>
              (&local_178,0,(StreamWriterLE *)local_f0,(bool)(this->binary & 1),local_104);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&CreationTimeStamp.property_start + 7));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"CreationTimeStamp",(allocator<char> *)((long)&rawtime + 7));
  FBX::Node::Node((Node *)local_1f0,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)((long)&rawtime + 7));
  time((time_t *)&now);
  local_228 = localtime((time_t *)&now);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"Version",&local_249);
  FBX::Node::AddChild<int>((Node *)local_1f0,&local_248,1000);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"Year",&local_271);
  FBX::Node::AddChild<int>((Node *)local_1f0,&local_270,local_228->tm_year + 0x76c);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"Month",&local_299);
  FBX::Node::AddChild<int>((Node *)local_1f0,&local_298,local_228->tm_mon + 1);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"Day",&local_2c1);
  FBX::Node::AddChild<int>((Node *)local_1f0,&local_2c0,local_228->tm_mday);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"Hour",&local_2e9);
  FBX::Node::AddChild<int>((Node *)local_1f0,&local_2e8,local_228->tm_hour);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"Minute",&local_311);
  FBX::Node::AddChild<int>((Node *)local_1f0,&local_310,local_228->tm_min);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"Second",&local_339);
  FBX::Node::AddChild<int>((Node *)local_1f0,&local_338,local_228->tm_sec);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"Millisecond",&local_361);
  FBX::Node::AddChild<int>((Node *)local_1f0,&local_360,0);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  FBX::Node::Dump((Node *)local_1f0,(StreamWriterLE *)local_f0,(bool)(this->binary & 1),local_104);
  std::__cxx11::stringstream::stringstream(local_4f0);
  poVar4 = std::operator<<(local_4e0,"Open Asset Import Library (Assimp) ");
  uVar3 = aiGetVersionMajor();
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
  poVar4 = std::operator<<(poVar4,".");
  uVar3 = aiGetVersionMinor();
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
  poVar4 = std::operator<<(poVar4,".");
  uVar3 = aiGetVersionRevision();
  std::ostream::operator<<(poVar4,uVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_510,"Creator",&local_511);
  std::__cxx11::stringstream::str();
  FBX::Node::WritePropertyNode<std::__cxx11::string>
            (&local_510,&local_538,(StreamWriterLE *)local_f0,(bool)(this->binary & 1),local_104);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator(&local_511);
  local_104 = 0;
  FBX::Node::End((Node *)local_80,(StreamWriterLE *)local_f0,(bool)(this->binary & 1),0,true);
  if ((this->binary & 1U) == 0) {
    raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    __n = std::__cxx11::string::size();
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&i + 7));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_558,__n,
               (allocator<unsigned_char> *)((long)&i + 7));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&i + 7));
    for (local_568 = 0; uVar2 = local_568, uVar5 = std::__cxx11::string::size(), uVar2 < uVar5;
        local_568 = local_568 + 1) {
      pvVar6 = (value_type *)std::__cxx11::string::operator[](0x101cf40);
      vVar1 = *pvVar6;
      pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_558,
                          local_568);
      *pvVar7 = vVar1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,"FileId",&local_589);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_5a8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_558);
    FBX::Node::WritePropertyNode<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (&local_588,&local_5a8,(StreamWriterLE *)local_f0,(bool)(this->binary & 1),local_104);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_5a8);
    std::__cxx11::string::~string((string *)&local_588);
    std::allocator<char>::~allocator(&local_589);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5c8,"CreationTime",&local_5c9);
    std::__cxx11::string::string((string *)&local_5f0,(string *)FBX::GENERIC_CTIME_abi_cxx11_);
    FBX::Node::WritePropertyNode<std::__cxx11::string>
              (&local_5c8,&local_5f0,(StreamWriterLE *)local_f0,(bool)(this->binary & 1),local_104);
    std::__cxx11::string::~string((string *)&local_5f0);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::allocator<char>::~allocator(&local_5c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_610,"Creator",&local_611);
    std::__cxx11::stringstream::str();
    FBX::Node::WritePropertyNode<std::__cxx11::string>
              (&local_610,&local_638,(StreamWriterLE *)local_f0,(bool)(this->binary & 1),local_104);
    std::__cxx11::string::~string((string *)&local_638);
    std::__cxx11::string::~string((string *)&local_610);
    std::allocator<char>::~allocator(&local_611);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_558);
    raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  }
  std::__cxx11::stringstream::~stringstream(local_4f0);
  FBX::Node::~Node((Node *)local_1f0);
  StreamWriter<false,_false>::~StreamWriter((StreamWriter<false,_false> *)local_f0);
  FBX::Node::~Node((Node *)local_80);
  return;
}

Assistant:

void FBXExporter::WriteHeaderExtension ()
{
    if (!binary) {
        // no title, follows directly from the top comment
    }
    FBX::Node n("FBXHeaderExtension");
    StreamWriterLE outstream(outfile);
    int indent = 0;

    // begin node
    n.Begin(outstream, binary, indent);

    // write properties
    // (none)

    // finish properties
    n.EndProperties(outstream, binary, indent, 0);

    // begin children
    n.BeginChildren(outstream, binary, indent);

    indent = 1;

    // write child nodes
    FBX::Node::WritePropertyNode(
        "FBXHeaderVersion", int32_t(1003), outstream, binary, indent
    );
    FBX::Node::WritePropertyNode(
        "FBXVersion", int32_t(EXPORT_VERSION_INT), outstream, binary, indent
    );
    if (binary) {
        FBX::Node::WritePropertyNode(
            "EncryptionType", int32_t(0), outstream, binary, indent
        );
    }

    FBX::Node CreationTimeStamp("CreationTimeStamp");
    time_t rawtime;
    time(&rawtime);
    struct tm * now = localtime(&rawtime);
    CreationTimeStamp.AddChild("Version", int32_t(1000));
    CreationTimeStamp.AddChild("Year", int32_t(now->tm_year + 1900));
    CreationTimeStamp.AddChild("Month", int32_t(now->tm_mon + 1));
    CreationTimeStamp.AddChild("Day", int32_t(now->tm_mday));
    CreationTimeStamp.AddChild("Hour", int32_t(now->tm_hour));
    CreationTimeStamp.AddChild("Minute", int32_t(now->tm_min));
    CreationTimeStamp.AddChild("Second", int32_t(now->tm_sec));
    CreationTimeStamp.AddChild("Millisecond", int32_t(0));
    CreationTimeStamp.Dump(outstream, binary, indent);

    std::stringstream creator;
    creator << "Open Asset Import Library (Assimp) " << aiGetVersionMajor()
            << "." << aiGetVersionMinor() << "." << aiGetVersionRevision();
    FBX::Node::WritePropertyNode(
        "Creator", creator.str(), outstream, binary, indent
    );

    //FBX::Node sceneinfo("SceneInfo");
    //sceneinfo.AddProperty("GlobalInfo" + FBX::SEPARATOR + "SceneInfo");
    // not sure if any of this is actually needed,
    // so just write an empty node for now.
    //sceneinfo.Dump(outstream, binary, indent);

    indent = 0;

    // finish node
    n.End(outstream, binary, indent, true);

    // that's it for FBXHeaderExtension...
    if (!binary) { return; }

    // but binary files also need top-level FileID, CreationTime, Creator:
    std::vector<uint8_t> raw(GENERIC_FILEID.size());
    for (size_t i = 0; i < GENERIC_FILEID.size(); ++i) {
        raw[i] = uint8_t(GENERIC_FILEID[i]);
    }
    FBX::Node::WritePropertyNode(
        "FileId", raw, outstream, binary, indent
    );
    FBX::Node::WritePropertyNode(
        "CreationTime", GENERIC_CTIME, outstream, binary, indent
    );
    FBX::Node::WritePropertyNode(
        "Creator", creator.str(), outstream, binary, indent
    );
}